

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall List::draw(List *this)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  Theme *pTVar7;
  int iVar8;
  pointer pbVar9;
  pointer pbVar10;
  int iVar11;
  ulong uVar12;
  undefined8 in_XMM1_Qa;
  undefined8 uVar13;
  undefined8 uVar14;
  SaveState state;
  undefined1 local_430 [1024];
  
  pTVar7 = ((this->super_Widget).dialog)->theme;
  al_store_state(local_430,0xffff);
  uVar13._0_4_ = (pTVar7->bg).r;
  uVar13._4_4_ = (pTVar7->bg).g;
  uVar14._0_4_ = (pTVar7->bg).b;
  uVar14._4_4_ = (pTVar7->bg).a;
  iVar8 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  if ((char)iVar8 != '\0') {
    uVar13 = al_map_rgb(0x40,0x40,0x40);
    uVar14 = in_XMM1_Qa;
  }
  al_draw_filled_rectangle
            ((float)((this->super_Widget).x1 + 1),(float)((this->super_Widget).y1 + 1),
             (float)((this->super_Widget).x2 + -1),(float)((this->super_Widget).y2 + -1),uVar13,
             uVar14);
  al_set_blender(0,1,3);
  iVar8 = al_get_font_line_height(pTVar7->font);
  pbVar9 = (this->items).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (this->items).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar9) {
    iVar11 = 0;
    uVar12 = 0;
    do {
      iVar6 = (this->super_Widget).y1;
      iVar1 = iVar6 + iVar11;
      if ((uint)uVar12 == this->selected_item) {
        uVar3._0_4_ = (pTVar7->highlight).r;
        uVar3._4_4_ = (pTVar7->highlight).g;
        uVar4._0_4_ = (pTVar7->highlight).b;
        uVar4._4_4_ = (pTVar7->highlight).a;
        al_draw_filled_rectangle
                  ((float)((this->super_Widget).x1 + 1),(float)iVar1,
                   (float)((this->super_Widget).x2 + -1),(float)(iVar6 + iVar8 + -1 + iVar11),uVar3,
                   uVar4);
        pbVar9 = (this->items).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar10 = (this->items).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if ((ulong)((long)pbVar10 - (long)pbVar9 >> 5) <= uVar12) {
        uVar13 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,uVar12);
        al_restore_state(local_430);
        _Unwind_Resume(uVar13);
      }
      uVar2 = (pTVar7->fg).r;
      uVar5._0_4_ = (pTVar7->fg).b;
      uVar5._4_4_ = (pTVar7->fg).a;
      al_draw_text(uVar2,uVar5,(float)(this->super_Widget).x1,(float)iVar1,pTVar7->font,0,
                   pbVar9[uVar12]._M_dataplus._M_p);
      uVar12 = (ulong)((uint)uVar12 + 1);
      pbVar9 = (this->items).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = (this->items).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      iVar11 = iVar11 + iVar8;
    } while (uVar12 < (ulong)((long)pbVar10 - (long)pbVar9 >> 5));
  }
  al_restore_state(local_430);
  return;
}

Assistant:

void List::draw()
{
   const Theme & theme = dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1 + 1, y1 + 1, x2 - 1, y2 - 1, bg);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
   const int font_height = al_get_font_line_height(theme.font);
   for (unsigned i = 0; i < items.size(); i++) {
      int yi = y1 + i * font_height;

      if (i == selected_item) {
         al_draw_filled_rectangle(x1 + 1, yi, x2 - 1, yi + font_height - 1,
            theme.highlight);
      }

      al_draw_text(theme.font, theme.fg, x1, yi, 0, items.at(i).c_str());
   }
}